

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void fill_suite::expand_fill_n_full(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  bool bVar2;
  reference piVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  iterator_type local_58;
  circular_view<int,_18446744073709551615UL> local_48;
  type local_28 [4];
  
  local_48.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_48.member.cap = 4;
  local_48.member.size = 0;
  local_48.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_48,4);
  uVar1 = local_48.member.cap * 2;
  if ((uVar1 & local_48.member.cap * 2 - 1) == 0) {
    piVar4 = (int *)(uVar1 - 1 & local_48.member.next - local_48.member.size);
  }
  else {
    piVar4 = (int *)((local_48.member.next - local_48.member.size) % uVar1);
  }
  if (local_48.member.cap != 0) {
    local_58.current = local_48.member.cap + (long)piVar4;
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&local_48;
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = piVar4;
    local_58.parent = &local_48;
    bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                      ((basic_iterator<int> *)&local_80,&local_58);
    if (!bVar2) {
      do {
        piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                           ((basic_iterator<int> *)&local_80);
        *piVar3 = 0x37;
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  ((basic_iterator<int> *)&local_80);
        bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                          ((basic_iterator<int> *)&local_80,&local_58);
      } while (!bVar2);
    }
  }
  local_58.parent = (view_pointer)0x3700000037;
  local_58.current = 0x3700000037;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_81);
  uVar1 = local_48.member.cap * 2;
  uVar5 = uVar1 - (local_48.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    uVar6 = uVar1 - 1 & local_48.member.next - local_48.member.size;
  }
  else {
    uVar6 = (local_48.member.next - local_48.member.size) % uVar1;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_48.member.next;
  }
  else {
    sStack_60 = local_48.member.next % uVar1;
  }
  first_end.current = sStack_60;
  first_end.parent = &local_48;
  first_begin.current = uVar6;
  first_begin.parent = &local_48;
  local_68 = &local_48;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x10a,"void fill_suite::expand_fill_n_full()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_fill_n_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.expand_back(span.capacity());
    std::fill_n(span.begin(), span.capacity(), 55);
    {
        std::vector<int> expect = { 55, 55, 55, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}